

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_fcmlas_idx_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  float32 fVar5;
  float32 fVar6;
  ulong opr_sz_00;
  ulong uVar7;
  uintptr_t max_sz;
  uint local_c0;
  uint local_b8;
  float32 e4;
  float32 e2;
  float32 e3;
  float32 e1;
  float32 mi;
  float32 mr;
  intptr_t j;
  intptr_t i;
  intptr_t eltspersegment;
  intptr_t elements;
  uint32_t neg_real;
  intptr_t index;
  uint32_t neg_imag;
  intptr_t flip;
  float_status *fpst;
  float32 *m;
  float32 *n;
  float32 *d;
  uintptr_t opr_sz;
  uint32_t desc_local;
  void *vfpst_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  uVar2 = extract32(desc,10,1);
  uVar7 = (ulong)uVar2;
  uVar3 = extract32(desc,0xb,1);
  uVar4 = extract32(desc,0xc,2);
  for (j = 0; j < (long)(opr_sz_00 >> 2); j = j + 4) {
    uVar1 = *(uint *)((long)vm + (j + (ulong)uVar4 * 2) * 4);
    local_c0 = *(uint *)((long)vm + (j + (ulong)uVar4 * 2) * 4 + 4);
    local_b8 = uVar1;
    if (uVar7 != 0) {
      local_b8 = local_c0;
    }
    if (uVar7 != 0) {
      local_c0 = uVar1;
    }
    for (_mi = j; _mi < j + 4; _mi = _mi + 2) {
      fVar6 = *(float32 *)((long)vn + (_mi + uVar7) * 4);
      fVar5 = float32_muladd_arm(fVar6,(uVar2 ^ uVar3) << 0x1f ^ local_b8,
                                 *(float32 *)((long)vd + _mi * 4),0,(float_status *)vfpst);
      *(float32 *)((long)vd + _mi * 4) = fVar5;
      fVar6 = float32_muladd_arm(fVar6,uVar3 << 0x1f ^ local_c0,*(float32 *)((long)vd + _mi * 4 + 4)
                                 ,0,(float_status *)vfpst);
      *(float32 *)((long)vd + _mi * 4 + 4) = fVar6;
    }
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_fcmlas_idx)(void *vd, void *vn, void *vm,
                             void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float32 *d = vd;
    float32 *n = vn;
    float32 *m = vm;
    float_status *fpst = vfpst;
    intptr_t flip = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    intptr_t index = extract32(desc, SIMD_DATA_SHIFT + 2, 2);
    uint32_t neg_real = flip ^ neg_imag;
    intptr_t elements = opr_sz / sizeof(float32);
    intptr_t eltspersegment = 16 / sizeof(float32);
    intptr_t i, j;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 31;
    neg_imag <<= 31;

    for (i = 0; i < elements; i += eltspersegment) {
        float32 mr = m[H4(i + 2 * index + 0)];
        float32 mi = m[H4(i + 2 * index + 1)];
        float32 e1 = neg_real ^ (flip ? mi : mr);
        float32 e3 = neg_imag ^ (flip ? mr : mi);

        for (j = i; j < i + eltspersegment; j += 2) {
            float32 e2 = n[H4(j + flip)];
            float32 e4 = e2;

            d[H4(j)] = float32_muladd(e2, e1, d[H4(j)], 0, fpst);
            d[H4(j + 1)] = float32_muladd(e4, e3, d[H4(j + 1)], 0, fpst);
        }
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}